

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplekey.cpp
# Opt level: O2

void __thiscall YAML::Scanner::SimpleKey::Validate(SimpleKey *this)

{
  if (this->pIndent != (IndentMarker *)0x0) {
    this->pIndent->status = VALID;
  }
  if (this->pMapStart != (Token *)0x0) {
    this->pMapStart->status = VALID;
  }
  if (this->pKey != (Token *)0x0) {
    this->pKey->status = VALID;
  }
  return;
}

Assistant:

void Scanner::SimpleKey::Validate() {
  // Note: pIndent will *not* be garbage here;
  //       we "garbage collect" them so we can
  //       always refer to them
  if (pIndent)
    pIndent->status = IndentMarker::VALID;
  if (pMapStart)
    pMapStart->status = Token::VALID;
  if (pKey)
    pKey->status = Token::VALID;
}